

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::ObjCObjFieldGenerator::ObjCObjFieldGenerator
          (ObjCObjFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  bool bVar1;
  mapped_type *pmVar2;
  allocator local_a1;
  key_type local_a0;
  allocator local_79;
  key_type local_78;
  allocator local_41;
  key_type local_40;
  Options *local_20;
  Options *options_local;
  FieldDescriptor *descriptor_local;
  ObjCObjFieldGenerator *this_local;
  
  local_20 = options;
  options_local = (Options *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  SingleFieldGenerator::SingleFieldGenerator(&this->super_SingleFieldGenerator,descriptor,options);
  (this->super_SingleFieldGenerator).super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__ObjCObjFieldGenerator_008e8d88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"property_storage_attribute",&local_41);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_SingleFieldGenerator).super_FieldGenerator.variables_,
                        &local_40);
  std::__cxx11::string::operator=((string *)pmVar2,"strong");
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"name",&local_79);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_SingleFieldGenerator).super_FieldGenerator.variables_,
                        &local_78);
  bVar1 = IsRetainedName(pmVar2);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"storage_attribute",&local_a1);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_SingleFieldGenerator).super_FieldGenerator.variables_,
                          &local_a0);
    std::__cxx11::string::operator=((string *)pmVar2," NS_RETURNS_NOT_RETAINED");
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  return;
}

Assistant:

ObjCObjFieldGenerator::ObjCObjFieldGenerator(const FieldDescriptor* descriptor,
                                             const Options& options)
    : SingleFieldGenerator(descriptor, options) {
  variables_["property_storage_attribute"] = "strong";
  if (IsRetainedName(variables_["name"])) {
    variables_["storage_attribute"] = " NS_RETURNS_NOT_RETAINED";
  }
}